

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O3

void __thiscall OpenMD::DynamicRectMatrix<double>::deallocate(DynamicRectMatrix<double> *this)

{
  ulong uVar1;
  
  if (this->nrow_ != 0) {
    uVar1 = 0;
    do {
      operator_delete(this->data_[uVar1],8);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->nrow_);
  }
  if (this->data_ != (double **)0x0) {
    operator_delete__(this->data_);
  }
  this->data_ = (double **)0x0;
  this->nrow_ = 0;
  this->ncol_ = 0;
  return;
}

Assistant:

void deallocate() {
      for (unsigned int i = 0; i < nrow_; ++i)
        delete data_[i];
      delete[] data_;

      nrow_ = 0;
      ncol_ = 0;
      data_ = NULL;
    }